

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_compute.cpp
# Opt level: O2

int main(void)

{
  int iVar1;
  int iVar2;
  Data data;
  Init init;
  
  Init::Init(&init);
  iVar1 = device_initialization(&init);
  iVar2 = -1;
  if (iVar1 == 0) {
    iVar1 = get_queues(&init,&data);
    if (iVar1 == 0) {
      create_descriptor(&init,&data);
      create_compute_pipeline(&init,&data);
      create_command_pool(&init,&data);
      create_buffers(&init,&data);
      create_and_submit_work(&init,&data);
      iVar2 = 0;
      cleanup((EVP_PKEY_CTX *)&init);
    }
  }
  vkb::Device::~Device(&init.device);
  return iVar2;
}

Assistant:

int main() {
    Init init;
    Data data;

    if (0 != device_initialization(init)) return -1;
    if (0 != get_queues(init, data)) return -1;
    // We are not error checking here, not good practice, but this is just an example program!
    create_descriptor(init, data);
    create_compute_pipeline(init, data);
    create_command_pool(init, data);
    create_buffers(init, data);
    create_and_submit_work(init, data);
    cleanup(init, data);
    return 0;
}